

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O2

CURLcode Curl_auth_decode_digest_http_message(char *chlg,digestdata *digest)

{
  byte bVar1;
  byte *pbVar2;
  _Bool _Var3;
  int iVar4;
  ushort **ppuVar5;
  char *pcVar6;
  ulong uVar7;
  byte *local_568;
  ulong local_560;
  ulong local_558;
  char *tok_buf;
  char *local_548;
  char *local_540;
  char value [256];
  char content [1024];
  
  local_540 = digest->nonce;
  local_568 = (byte *)chlg;
  Curl_auth_digest_cleanup(digest);
  local_558 = 0;
  local_560 = 0;
  pbVar2 = local_568;
  do {
    while ((local_568 = pbVar2, bVar1 = *chlg, (ulong)bVar1 != 0 &&
           (ppuVar5 = __ctype_b_loc(),
           (*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 0x20) != 0))) {
      chlg = (char *)((byte *)chlg + 1);
      pbVar2 = local_568;
    }
    local_568 = (byte *)chlg;
    _Var3 = Curl_auth_digest_get_pair(chlg,value,content,(char **)&local_568);
    if (!_Var3) {
      if ((local_540 != (char *)0x0) && (digest->stale != true)) {
        return CURLE_BAD_CONTENT_ENCODING;
      }
      if (digest->nonce != (char *)0x0) {
        return CURLE_OK;
      }
      return CURLE_BAD_CONTENT_ENCODING;
    }
    iVar4 = Curl_strcasecompare(value,"nonce");
    if (iVar4 != 0) {
      (*Curl_cfree)(digest->nonce);
      pcVar6 = (*Curl_cstrdup)(content);
      digest->nonce = pcVar6;
      goto LAB_0059ad84;
    }
    iVar4 = Curl_strcasecompare(value,"stale");
    if (iVar4 != 0) {
      iVar4 = Curl_strcasecompare(content,"true");
      chlg = (char *)local_568;
      if (iVar4 != 0) {
        digest->stale = true;
        digest->nc = 1;
      }
      goto LAB_0059ad91;
    }
    iVar4 = Curl_strcasecompare(value,"realm");
    if (iVar4 == 0) {
      iVar4 = Curl_strcasecompare(value,"opaque");
      if (iVar4 != 0) {
        (*Curl_cfree)(digest->opaque);
        pcVar6 = (*Curl_cstrdup)(content);
        digest->opaque = pcVar6;
        goto LAB_0059ad84;
      }
      iVar4 = Curl_strcasecompare(value,"qop");
      if (iVar4 != 0) {
        tok_buf = (char *)0x0;
        local_548 = (*Curl_cstrdup)(content);
        if (local_548 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar6 = strtok_r(local_548,",",&tok_buf);
        uVar7 = local_558;
        while (pcVar6 != (char *)0x0) {
          iVar4 = Curl_strcasecompare(pcVar6,"auth");
          if (iVar4 == 0) {
            iVar4 = Curl_strcasecompare(pcVar6,"auth-int");
            local_560 = CONCAT71((int7)(local_560 >> 8),(byte)local_560 | iVar4 != 0);
          }
          else {
            uVar7 = CONCAT71((int7)(uVar7 >> 8),1);
          }
          pcVar6 = strtok_r((char *)0x0,",",&tok_buf);
        }
        (*Curl_cfree)(local_548);
        local_558 = uVar7;
        if ((uVar7 & 1) == 0) {
          chlg = (char *)local_568;
          if ((local_560 & 1) == 0) goto LAB_0059ad91;
          (*Curl_cfree)(digest->qop);
          pcVar6 = "auth-int";
        }
        else {
          (*Curl_cfree)(digest->qop);
          pcVar6 = "auth";
        }
        pcVar6 = (*Curl_cstrdup)(pcVar6);
        digest->qop = pcVar6;
        goto LAB_0059ad84;
      }
      iVar4 = Curl_strcasecompare(value,"algorithm");
      chlg = (char *)local_568;
      if (iVar4 != 0) {
        (*Curl_cfree)(digest->algorithm);
        pcVar6 = (*Curl_cstrdup)(content);
        digest->algorithm = pcVar6;
        if (pcVar6 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        iVar4 = Curl_strcasecompare(content,"MD5-sess");
        if (iVar4 == 0) {
          iVar4 = Curl_strcasecompare(content,"MD5");
          if (iVar4 == 0) {
            return CURLE_BAD_CONTENT_ENCODING;
          }
          digest->algo = 0;
          chlg = (char *)local_568;
        }
        else {
          digest->algo = 1;
          chlg = (char *)local_568;
        }
      }
    }
    else {
      (*Curl_cfree)(digest->realm);
      pcVar6 = (*Curl_cstrdup)(content);
      digest->realm = pcVar6;
LAB_0059ad84:
      chlg = (char *)local_568;
      if (pcVar6 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
LAB_0059ad91:
    while( true ) {
      bVar1 = *chlg;
      pbVar2 = (byte *)chlg;
      if ((ulong)bVar1 == 0) break;
      ppuVar5 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 0x20) == 0) {
        pbVar2 = (byte *)chlg;
        if (bVar1 == 0x2c) {
          chlg = (char *)((byte *)chlg + 1);
          pbVar2 = (byte *)chlg;
        }
        break;
      }
      chlg = (char *)((byte *)chlg + 1);
    }
  } while( true );
}

Assistant:

CURLcode Curl_auth_decode_digest_http_message(const char *chlg,
                                              struct digestdata *digest)
{
  bool before = FALSE; /* got a nonce before */
  bool foundAuth = FALSE;
  bool foundAuthInt = FALSE;
  char *token = NULL;
  char *tmp = NULL;

  /* If we already have received a nonce, keep that in mind */
  if(digest->nonce)
    before = TRUE;

  /* Clean up any former leftovers and initialise to defaults */
  Curl_auth_digest_cleanup(digest);

  for(;;) {
    char value[DIGEST_MAX_VALUE_LENGTH];
    char content[DIGEST_MAX_CONTENT_LENGTH];

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Extract a value=content pair */
    if(Curl_auth_digest_get_pair(chlg, value, content, &chlg)) {
      if(strcasecompare(value, "nonce")) {
        free(digest->nonce);
        digest->nonce = strdup(content);
        if(!digest->nonce)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "stale")) {
        if(strcasecompare(content, "true")) {
          digest->stale = TRUE;
          digest->nc = 1; /* we make a new nonce now */
        }
      }
      else if(strcasecompare(value, "realm")) {
        free(digest->realm);
        digest->realm = strdup(content);
        if(!digest->realm)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "opaque")) {
        free(digest->opaque);
        digest->opaque = strdup(content);
        if(!digest->opaque)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "qop")) {
        char *tok_buf = NULL;
        /* Tokenize the list and choose auth if possible, use a temporary
           clone of the buffer since strtok_r() ruins it */
        tmp = strdup(content);
        if(!tmp)
          return CURLE_OUT_OF_MEMORY;

        token = strtok_r(tmp, ",", &tok_buf);
        while(token != NULL) {
          if(strcasecompare(token, DIGEST_QOP_VALUE_STRING_AUTH)) {
            foundAuth = TRUE;
          }
          else if(strcasecompare(token, DIGEST_QOP_VALUE_STRING_AUTH_INT)) {
            foundAuthInt = TRUE;
          }
          token = strtok_r(NULL, ",", &tok_buf);
        }

        free(tmp);

        /* Select only auth or auth-int. Otherwise, ignore */
        if(foundAuth) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
        else if(foundAuthInt) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH_INT);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else if(strcasecompare(value, "algorithm")) {
        free(digest->algorithm);
        digest->algorithm = strdup(content);
        if(!digest->algorithm)
          return CURLE_OUT_OF_MEMORY;

        if(strcasecompare(content, "MD5-sess"))
          digest->algo = CURLDIGESTALGO_MD5SESS;
        else if(strcasecompare(content, "MD5"))
          digest->algo = CURLDIGESTALGO_MD5;
        else
          return CURLE_BAD_CONTENT_ENCODING;
      }
      else {
        /* Unknown specifier, ignore it! */
      }
    }
    else
      break; /* We're done here */

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Allow the list to be comma-separated */
    if(',' == *chlg)
      chlg++;
  }

  /* We had a nonce since before, and we got another one now without
     'stale=true'. This means we provided bad credentials in the previous
     request */
  if(before && !digest->stale)
    return CURLE_BAD_CONTENT_ENCODING;

  /* We got this header without a nonce, that's a bad Digest line! */
  if(!digest->nonce)
    return CURLE_BAD_CONTENT_ENCODING;

  return CURLE_OK;
}